

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

void __thiscall Js::RecyclableObject::ClearWritableDataOnlyDetectionBit(RecyclableObject *this)

{
  bool bVar1;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  
  while( true ) {
    bVar1 = DynamicType::Is(**(TypeId **)((long)this + 8));
    if (!bVar1) {
      return;
    }
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    DynamicTypeHandler::ClearWritableDataOnlyDetectionBit(this_01);
    bVar1 = DynamicObject::HasObjectArray(this_00);
    if (!bVar1) break;
    this = *(RecyclableObject **)&this_00->field_1;
  }
  return;
}

Assistant:

void RecyclableObject::ClearWritableDataOnlyDetectionBit()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            obj->GetTypeHandler()->ClearWritableDataOnlyDetectionBit();
            if (obj->HasObjectArray())
            {
                obj->GetObjectArrayOrFlagsAsArray()->ClearWritableDataOnlyDetectionBit();
            }
        }
    }